

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_try::dump(statement_try *this,ostream *o)

{
  bool bVar1;
  ostream *poVar2;
  ostream *in_RSI;
  _Self *in_RDI;
  statement_base **ptr_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1_1;
  statement_base **ptr;
  const_iterator __end1;
  const_iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  *in_stack_ffffffffffffff50;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_88;
  _Elt_pointer *local_68;
  reference local_60;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_38;
  _Self *local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"< Try >\n");
  local_18 = in_RDI + 2;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDI);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDI);
  while( true ) {
    bVar1 = std::operator!=(in_stack_ffffffffffffff50,in_RDI);
    if (!bVar1) break;
    local_60 = std::
               _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
               ::operator*(&local_38);
    (*(*local_60)->_vptr_statement_base[5])(*local_60,local_10);
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator++(in_stack_ffffffffffffff50);
  }
  poVar2 = std::operator<<(local_10,"< Catch: ID = \"");
  poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 1));
  std::operator<<(poVar2,"\" >\n");
  local_68 = &in_RDI[4]._M_last;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDI);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDI);
  while( true ) {
    bVar1 = std::operator!=(in_stack_ffffffffffffff50,in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffff50 =
         (_Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
          *)std::
            _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
            ::operator*(&local_88);
    (*((statement_base *)in_stack_ffffffffffffff50->_M_cur)->_vptr_statement_base[5])
              ((statement_base *)in_stack_ffffffffffffff50->_M_cur,local_10);
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator++(in_stack_ffffffffffffff50);
  }
  std::operator<<(local_10,"< EndTry >\n");
  return;
}

Assistant:

void statement_try::dump(std::ostream &o) const
	{
		o << "< Try >\n";
		for (auto &ptr: mTryBody)
			ptr->dump(o);
		o << "< Catch: ID = \"" << mName << "\" >\n";
		for (auto &ptr: mCatchBody)
			ptr->dump(o);
		o << "< EndTry >\n";
	}